

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationCoordinatesTests.cpp
# Opt level: O0

bool vkt::tessellation::anon_unknown_0::compareTessCoords
               (TestLog *log,TessPrimitiveType primitiveType,
               vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *refCoords,
               vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *resCoords)

{
  byte bVar1;
  bool bVar2;
  MessageBuilder *pMVar3;
  TestLog *pTVar4;
  byte local_57a;
  byte local_552;
  allocator<char> local_529;
  string local_528;
  allocator<char> local_501;
  string local_500;
  LogImage local_4e0;
  allocator<char> local_449;
  string local_448;
  allocator<char> local_421;
  string local_420;
  LogImage local_400;
  MessageBuilder local_370;
  MessageBuilder local_1f0;
  RGBA local_70;
  RGBA local_6c;
  byte local_65;
  bool success;
  undefined1 local_58 [8];
  Surface resVisual;
  Surface refVisual;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *resCoords_local;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *refCoords_local;
  TessPrimitiveType primitiveType_local;
  TestLog *log_local;
  
  tcu::Surface::Surface((Surface *)&resVisual.m_pixels.m_cap);
  tcu::Surface::Surface((Surface *)local_58);
  local_65 = 1;
  drawTessCoordVisualization((Surface *)&resVisual.m_pixels.m_cap,primitiveType,refCoords);
  drawTessCoordVisualization((Surface *)local_58,primitiveType,resCoords);
  local_6c = tcu::RGBA::blue();
  bVar2 = oneWayComparePointSets
                    (log,(Surface *)&resVisual.m_pixels.m_cap,primitiveType,refCoords,resCoords,
                     "reference","result",&local_6c);
  local_552 = 0;
  if (bVar2) {
    local_552 = local_65;
  }
  local_65 = local_552 & 1;
  local_70 = tcu::RGBA::red();
  bVar2 = oneWayComparePointSets
                    (log,(Surface *)local_58,primitiveType,resCoords,refCoords,"result","reference",
                     &local_70);
  local_57a = 0;
  if (bVar2) {
    local_57a = local_65;
  }
  local_65 = local_57a & 1;
  if (local_65 == 0) {
    tcu::TestLog::operator<<(&local_370,log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_370,
                        (char (*) [110])
                        "Note: in the following reference visualization, points that are missing in result point set are blue (if any)"
                       );
    pTVar4 = tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_420,"RefTessCoordVisualization",&local_421);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_448,"Reference tessCoord visualization",&local_449);
    tcu::LogImage::LogImage
              (&local_400,&local_420,&local_448,(Surface *)&resVisual.m_pixels.m_cap,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_400);
    tcu::TestLog::operator<<(&local_1f0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_1f0,
                        (char (*) [109])
                        "Note: in the following result visualization, points that are missing in reference point set are red (if any)"
                       );
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1f0);
    tcu::LogImage::~LogImage(&local_400);
    std::__cxx11::string::~string((string *)&local_448);
    std::allocator<char>::~allocator(&local_449);
    std::__cxx11::string::~string((string *)&local_420);
    std::allocator<char>::~allocator(&local_421);
    tcu::MessageBuilder::~MessageBuilder(&local_370);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_500,"ResTessCoordVisualization",&local_501);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_528,"Result tessCoord visualization",&local_529);
  tcu::LogImage::LogImage
            (&local_4e0,&local_500,&local_528,(Surface *)local_58,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::TestLog::operator<<(log,&local_4e0);
  tcu::LogImage::~LogImage(&local_4e0);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator(&local_529);
  std::__cxx11::string::~string((string *)&local_500);
  std::allocator<char>::~allocator(&local_501);
  bVar1 = local_65;
  tcu::Surface::~Surface((Surface *)local_58);
  tcu::Surface::~Surface((Surface *)&resVisual.m_pixels.m_cap);
  return (bool)(bVar1 & 1);
}

Assistant:

bool compareTessCoords (tcu::TestLog&					log,
						TessPrimitiveType				primitiveType,
						const std::vector<tcu::Vec3>&	refCoords,
						const std::vector<tcu::Vec3>&	resCoords)
{
	tcu::Surface	refVisual;
	tcu::Surface	resVisual;
	bool			success = true;

	drawTessCoordVisualization(refVisual, primitiveType, refCoords);
	drawTessCoordVisualization(resVisual, primitiveType, resCoords);

	// Check that all points in reference also exist in result.
	success = oneWayComparePointSets(log, refVisual, primitiveType, refCoords, resCoords, "reference", "result", tcu::RGBA::blue()) && success;
	// Check that all points in result also exist in reference.
	success = oneWayComparePointSets(log, resVisual, primitiveType, resCoords, refCoords, "result", "reference", tcu::RGBA::red()) && success;

	if (!success)
	{
		log << tcu::TestLog::Message << "Note: in the following reference visualization, points that are missing in result point set are blue (if any)" << tcu::TestLog::EndMessage
			<< tcu::TestLog::Image("RefTessCoordVisualization", "Reference tessCoord visualization", refVisual)
			<< tcu::TestLog::Message << "Note: in the following result visualization, points that are missing in reference point set are red (if any)" << tcu::TestLog::EndMessage;
	}

	log << tcu::TestLog::Image("ResTessCoordVisualization", "Result tessCoord visualization", resVisual);

	return success;
}